

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.cpp
# Opt level: O1

void __thiscall icu_63::anon_unknown_4::SortKeyLevel::appendWeight16(SortKeyLevel *this,uint32_t w)

{
  UBool UVar1;
  uchar uVar2;
  int iVar3;
  
  uVar2 = (uchar)w;
  iVar3 = 2 - (uint)(uVar2 == '\0');
  if (((this->buffer).capacity < this->len + iVar3) &&
     (UVar1 = ensureCapacity(this,iVar3), UVar1 == '\0')) {
    return;
  }
  iVar3 = this->len;
  this->len = iVar3 + 1;
  (this->buffer).ptr[iVar3] = (uchar)(w >> 8);
  if (uVar2 != '\0') {
    iVar3 = this->len;
    this->len = iVar3 + 1;
    (this->buffer).ptr[iVar3] = uVar2;
  }
  return;
}

Assistant:

void
SortKeyLevel::appendWeight16(uint32_t w) {
    U_ASSERT((w & 0xffff) != 0);
    uint8_t b0 = (uint8_t)(w >> 8);
    uint8_t b1 = (uint8_t)w;
    int32_t appendLength = (b1 == 0) ? 1 : 2;
    if((len + appendLength) <= buffer.getCapacity() || ensureCapacity(appendLength)) {
        buffer[len++] = b0;
        if(b1 != 0) {
            buffer[len++] = b1;
        }
    }
}